

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O3

bool libcalc::isOperator(char symbol)

{
  return (bool)((byte)(0x2000000000005791 >> (symbol - 0x21U & 0x3f)) &
               (byte)(symbol - 0x21U) < 0x3e);
}

Assistant:

bool isOperator(const char symbol) {
  return (
      symbol == TOKEN_OPERATOR.ADD ||
      symbol == TOKEN_OPERATOR.SUB ||
      symbol == TOKEN_OPERATOR.MLT ||
      symbol == TOKEN_OPERATOR.DIV ||
      symbol == TOKEN_OPERATOR.LPN ||
      symbol == TOKEN_OPERATOR.RPN ||
      symbol == TOKEN_OPERATOR.MOD ||
      symbol == TOKEN_OPERATOR.PWR ||
      symbol == TOKEN_OPERATOR.FAC
      );
}